

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuStringTemplate.cpp
# Opt level: O2

string * __thiscall
tcu::StringTemplate::specialize
          (string *__return_storage_ptr__,StringTemplate *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *params)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  const_iterator cVar5;
  ulong uVar6;
  InternalError *pIVar7;
  allocator<char> local_261;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_260;
  string paramName;
  string paramStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string flagsStr;
  ostringstream res;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  uVar6 = 0;
  local_260 = &params->_M_t;
  while( true ) {
    lVar3 = std::__cxx11::string::find((char *)this,0x35c180);
    if (lVar3 == -1) {
      if (uVar6 < (this->m_template)._M_string_length) {
        std::operator<<((ostream *)&res,(this->m_template)._M_dataplus._M_p + uVar6);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&paramStr,(ulong)this);
    std::operator<<((ostream *)&res,(string *)&paramStr);
    std::__cxx11::string::~string((string *)&paramStr);
    lVar3 = std::__cxx11::string::find((char *)this,0x3268d8);
    if (lVar3 == -1) break;
    std::__cxx11::string::substr((ulong)&paramStr,(ulong)this);
    paramName._M_dataplus._M_p = (pointer)&paramName.field_2;
    paramName._M_string_length = 0;
    paramName.field_2._M_local_buf[0] = '\0';
    lVar4 = std::__cxx11::string::find((char *)&paramStr,0x331364);
    if (lVar4 == -1) {
      std::__cxx11::string::_M_assign((string *)&paramName);
      bVar1 = false;
      bVar2 = false;
    }
    else {
      std::__cxx11::string::substr((ulong)&flagsStr,(ulong)&paramStr);
      std::__cxx11::string::operator=((string *)&paramName,(string *)&flagsStr);
      std::__cxx11::string::~string((string *)&flagsStr);
      std::__cxx11::string::substr((ulong)&flagsStr,(ulong)&paramStr);
      bVar1 = std::operator==(&flagsStr,"single-line");
      if (!bVar1) {
        bVar2 = std::operator==(&flagsStr,"opt");
        if (!bVar2) {
          pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,"Unrecognized flag",&local_261);
          std::operator+(&local_1e8,&local_208,&paramStr);
          InternalError::InternalError
                    (pIVar7,local_1e8._M_dataplus._M_p,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuStringTemplate.cpp"
                     ,0x5c);
          __cxa_throw(pIVar7,&InternalError::typeinfo,Exception::~Exception);
        }
      }
      bVar2 = !bVar1;
      std::__cxx11::string::~string((string *)&flagsStr);
    }
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(local_260,&paramName);
    if ((_Rb_tree_header *)cVar5._M_node == &(params->_M_t)._M_impl.super__Rb_tree_header) {
      if (!bVar2) {
        pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"Value for parameter \'",&local_261);
        std::operator+(&local_1e8,&local_208,&paramName);
        std::operator+(&flagsStr,&local_1e8,"\' not found in map");
        InternalError::InternalError
                  (pIVar7,flagsStr._M_dataplus._M_p,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuStringTemplate.cpp"
                   ,0x71);
        __cxa_throw(pIVar7,&InternalError::typeinfo,Exception::~Exception);
      }
    }
    else {
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(local_260,&paramName);
      if (bVar1 == false) {
        std::operator<<((ostream *)&res,(string *)(cVar5._M_node + 2));
      }
      else {
        std::__cxx11::string::string((string *)&flagsStr,(string *)(cVar5._M_node + 2));
        while( true ) {
          uVar6 = std::__cxx11::string::find((char *)&flagsStr,0x33035e);
          if (uVar6 == 0xffffffffffffffff) break;
          std::__cxx11::string::replace((ulong)&flagsStr,uVar6,(char *)0x1);
          std::__cxx11::string::_M_assign((string *)&flagsStr);
        }
        std::operator<<((ostream *)&res,(string *)&flagsStr);
        std::__cxx11::string::~string((string *)&flagsStr);
      }
    }
    uVar6 = lVar3 + 1;
    std::__cxx11::string::~string((string *)&paramName);
    std::__cxx11::string::~string((string *)&paramStr);
  }
  pIVar7 = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (pIVar7,"No \'}\' found in template parameter",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuStringTemplate.cpp"
             ,0x46);
  __cxa_throw(pIVar7,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

string StringTemplate::specialize (const map<string, string>& params) const
{
	ostringstream res;

	size_t curNdx = 0;
	for (;;)
	{
		size_t paramNdx = m_template.find("${", curNdx);
		if (paramNdx != string::npos)
		{
			// Append in-between stuff.
			res << m_template.substr(curNdx, paramNdx - curNdx);

			// Find end-of-param.
			size_t paramEndNdx = m_template.find("}", paramNdx);
			if (paramEndNdx == string::npos)
				TCU_THROW(InternalError, "No '}' found in template parameter");

			// Parse parameter contents.
			string	paramStr		= m_template.substr(paramNdx+2, paramEndNdx-2-paramNdx);
			bool	paramSingleLine	= false;
			bool	paramOptional	= false;
			string	paramName;
			size_t colonNdx = paramStr.find(":");
			if (colonNdx != string::npos)
			{
				paramName = paramStr.substr(0, colonNdx);
				string flagsStr = paramStr.substr(colonNdx+1);
				if (flagsStr == "single-line")
				{
					paramSingleLine = true;
				}
				else if (flagsStr == "opt")
				{
					paramOptional = true;
				}
				else
				{
					TCU_THROW(InternalError, (string("Unrecognized flag") + paramStr).c_str());
				}
			}
			else
				paramName = paramStr;

			// Fill in parameter value.
			if (params.find(paramName) != params.end())
			{
				const string& val = (*params.find(paramName)).second;
				if (paramSingleLine)
				{
					string tmp = val;
					for (size_t ndx = tmp.find("\n"); ndx != string::npos; ndx = tmp.find("\n"))
						tmp = tmp.replace(ndx, 1, " ");
					res << tmp;
				}
				else
					res << val;
			}
			else if (!paramOptional)
				TCU_THROW(InternalError, (string("Value for parameter '") + paramName + "' not found in map").c_str());

			// Skip over template.
			curNdx = paramEndNdx + 1;
		}
		else
		{
			if (curNdx < m_template.length())
				res << &m_template[curNdx];

			break;
		}
	}

	return res.str();
}